

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_item.c
# Opt level: O0

TestItem * create_test_item_from(char *specification_name)

{
  TestItem *specification_name_00;
  char *pcVar1;
  char *in_RDI;
  TestItem *test_item;
  
  specification_name_00 = (TestItem *)malloc(0x18);
  pcVar1 = strdup(in_RDI);
  specification_name_00->specification_name = pcVar1;
  pcVar1 = context_name_from((char *)specification_name_00);
  specification_name_00->context_name = pcVar1;
  pcVar1 = test_name_from(specification_name);
  specification_name_00->test_name = pcVar1;
  return specification_name_00;
}

Assistant:

TestItem *create_test_item_from(const char *specification_name) {
    TestItem *test_item = (TestItem *)malloc(sizeof(TestItem));

    test_item->specification_name = strdup(specification_name);
    test_item->context_name = context_name_from(specification_name);
    test_item->test_name = test_name_from(specification_name);

    return test_item;
}